

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O3

void __thiscall
SkylineBinPack::SkylineBinPack(SkylineBinPack *this,int width,int height,bool useWasteMap)

{
  (this->skyLine).Array = (SkylineNode *)0x0;
  (this->skyLine).Most = 0;
  (this->skyLine).Count = 0;
  (this->disjointRects).rects.Array = (Rect *)0x0;
  (this->disjointRects).rects.Most = 0;
  (this->disjointRects).rects.Count = 0;
  GuillotineBinPack::GuillotineBinPack(&this->wasteMap);
  Init(this,width,height,useWasteMap);
  return;
}

Assistant:

SkylineBinPack::SkylineBinPack(int width, int height, bool useWasteMap)
{
	Init(width, height, useWasteMap);
}